

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_suite.cpp
# Opt level: O2

void api_dynamic_suite::dynamic_subspan(void)

{
  span<int,_18446744073709551615UL> sVar1;
  int array [4];
  span<int,_18446744073709551615UL> span;
  long local_68;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [8];
  undefined4 *local_40;
  undefined1 *local_38;
  
  local_38 = local_48;
  local_58 = 0xb;
  uStack_54 = 0x16;
  uStack_50 = 0x21;
  uStack_4c = 0x2c;
  local_68 = 4;
  local_5c = 4;
  local_40 = &local_58;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xba,"void api_dynamic_suite::dynamic_subspan()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,0xb);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xbb,"void api_dynamic_suite::dynamic_subspan()",&local_58,&local_68);
  sVar1 = vista::span<int,18446744073709551615ul>::subspan<2ul,18446744073709551615ul>
                    ((span<int,18446744073709551615ul> *)&local_40);
  local_68 = (long)sVar1.member.tail - (long)sVar1.member.head >> 2;
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("subspan.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xbd,"void api_dynamic_suite::dynamic_subspan()",&local_68,&local_5c);
  local_68 = CONCAT44(local_68._4_4_,0x21);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("subspan.front()","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/span_suite.cpp"
             ,0xbe,"void api_dynamic_suite::dynamic_subspan()",sVar1.member.head,&local_68);
  return;
}

Assistant:

void dynamic_subspan()
{
    int array[4] = { 11, 22, 33, 44 };
    vista::span<int> span(array);
    BOOST_TEST_EQ(span.size(), 4);
    BOOST_TEST_EQ(span.front(), 11);
    auto subspan = span.subspan<2>();
    BOOST_TEST_EQ(subspan.size(), 2);
    BOOST_TEST_EQ(subspan.front(), 33);
}